

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::commandBindDescriptorsForLayer
          (ImageStoreTestInstance *this,VkCommandBuffer cmdBuffer,VkPipelineLayout pipelineLayout,
          int layerNdx)

{
  deUint64 dVar1;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetUpdateBuilder *pDVar2;
  int __fd;
  VkDescriptorSet descriptorSet;
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  DescriptorSetUpdateBuilder local_90;
  VkDescriptorImageInfo descriptorImageInfo;
  
  vk = Context::getDeviceInterface
                 ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  dVar1 = *(deUint64 *)
           &(((this->m_allDescriptorSets).
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[layerNdx].m_ptr)->
            super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data;
  descriptorImageInfo.imageView.m_internal =
       *(deUint64 *)
        &(((this->m_allImageViews).
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[layerNdx].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data;
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  descriptorSet.m_internal = dVar1;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_90);
  __fd = (int)dVar1;
  pDVar2 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write(&local_90,__fd,(void *)0x0,0);
  pDVar2 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write(pDVar2,__fd,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar2,vk,device);
  if (local_90.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&local_90.m_writeDescriptorInfos);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,cmdBuffer,1,pipelineLayout.m_internal,0,1,&descriptorSet,0,0);
  return;
}

Assistant:

void ImageStoreTestInstance::commandBindDescriptorsForLayer (const VkCommandBuffer cmdBuffer, const VkPipelineLayout pipelineLayout, const int layerNdx)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const VkDescriptorSet descriptorSet = **m_allDescriptorSets[layerNdx];
	const VkImageView imageView = **m_allImageViews[layerNdx];

	const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo(DE_NULL, imageView, VK_IMAGE_LAYOUT_GENERAL);

	// Set the next chunk of the constants buffer. Each chunk begins with layer index that we've set before.
	const VkDescriptorBufferInfo descriptorConstantsBufferInfo = makeDescriptorBufferInfo(
		m_constantsBuffer->get(), layerNdx*m_constantsBufferChunkSizeBytes, m_constantsBufferChunkSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
		.update(vk, device);
	vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
}